

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O2

void __thiscall
jsonnet::internal::FixTrailingCommas::remove_comma
          (FixTrailingCommas *this,Fodder *last_comma_fodder,bool *trailing_comma,
          Fodder *close_fodder)

{
  Fodder local_30;
  
  if (*trailing_comma == true) {
    *trailing_comma = false;
    concat_fodder(&local_30,last_comma_fodder,close_fodder);
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::_M_move_assign(close_fodder,&local_30);
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::~vector(&local_30);
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::clear(last_comma_fodder);
  }
  return;
}

Assistant:

void remove_comma(Fodder &last_comma_fodder, bool &trailing_comma, Fodder &close_fodder)
    {
        if (trailing_comma) {
            // Remove it but keep fodder.
            trailing_comma = false;
            close_fodder = concat_fodder(last_comma_fodder, close_fodder);
            last_comma_fodder.clear();
        }
    }